

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_do(Curl_easy *data,_Bool *done)

{
  Curl_llist *list;
  void **ppvVar1;
  connectdata *pcVar2;
  undefined8 *puVar3;
  FILEPROTO *pFVar4;
  wildcard_dtor p_Var5;
  connectdata *pcVar6;
  connectdata *pcVar7;
  CURLcode CVar8;
  wildcard_states wVar9;
  CURLcode CVar10;
  char *pcVar11;
  long lVar12;
  char *pcVar13;
  ftp_parselist_data **parserp;
  ftp_parselist_data *pfVar14;
  int iVar15;
  CURLcode unaff_EBP;
  _Bool connected;
  bool bVar16;
  
  pcVar2 = data->conn;
  *done = false;
  (pcVar2->proto).ftpc.wait_data_conn = false;
  if (((data->state).field_0x6d0 & 0x40) != 0) {
    list = &(data->wildcard).filelist;
    ppvVar1 = &(data->wildcard).protdata;
    CVar10 = CURLE_OK;
    do {
      switch((data->wildcard).state) {
      case CURLWC_CLEAR:
      case CURLWC_ERROR:
      case CURLWC_DONE:
        goto switchD_005c57ce_caseD_0;
      case CURLWC_INIT:
        pFVar4 = (data->req).p.file;
        pcVar11 = pFVar4->path;
        pcVar13 = strrchr(pcVar11,0x2f);
        if (pcVar13 == (char *)0x0) {
          if (*pcVar11 != '\0') {
            pcVar13 = (*Curl_cstrdup)(pcVar11);
            (data->wildcard).pattern = pcVar13;
            goto LAB_005c5b14;
          }
LAB_005c5be9:
          (data->wildcard).state = CURLWC_CLEAN;
          unaff_EBP = ftp_parse_url_path(data);
        }
        else {
          if (pcVar13[1] == '\0') goto LAB_005c5be9;
          pcVar11 = pcVar13 + 1;
          pcVar13 = (*Curl_cstrdup)(pcVar11);
          (data->wildcard).pattern = pcVar13;
LAB_005c5b14:
          if (pcVar13 == (char *)0x0) {
            unaff_EBP = CURLE_OUT_OF_MEMORY;
          }
          else {
            *pcVar11 = '\0';
            parserp = (ftp_parselist_data **)(*Curl_ccalloc)(1,0x18);
            unaff_EBP = CURLE_OUT_OF_MEMORY;
            if (parserp != (ftp_parselist_data **)0x0) {
              pfVar14 = Curl_ftp_parselist_data_alloc();
              *parserp = pfVar14;
              if (pfVar14 != (ftp_parselist_data *)0x0) {
                (data->wildcard).protdata = parserp;
                (data->wildcard).dtor = wc_data_dtor;
                if ((data->set).ftp_filemethod == '\x02') {
                  (data->set).ftp_filemethod = '\x01';
                }
                unaff_EBP = ftp_parse_url_path(data);
                if (unaff_EBP == CURLE_OK) {
                  pcVar11 = (*Curl_cstrdup)(pFVar4->path);
                  (data->wildcard).path = pcVar11;
                  unaff_EBP = CURLE_OUT_OF_MEMORY;
                  if (pcVar11 != (char *)0x0) {
                    parserp[1] = (ftp_parselist_data *)(data->set).fwrite_func;
                    (data->set).fwrite_func = Curl_ftp_parselist;
                    parserp[2] = (ftp_parselist_data *)(data->set).out;
                    (data->set).out = data;
                    unaff_EBP = CURLE_OK;
                    Curl_infof(data,"Wildcard - Parsing started");
                    goto LAB_005c5c46;
                  }
                }
              }
            }
            if (parserp != (ftp_parselist_data **)0x0) {
              Curl_ftp_parselist_data_free(parserp);
              (*Curl_cfree)(parserp);
            }
            (*Curl_cfree)((data->wildcard).pattern);
            (data->wildcard).pattern = (char *)0x0;
            *ppvVar1 = (void *)0x0;
            (data->wildcard).dtor = (wildcard_dtor)0x0;
          }
        }
LAB_005c5c46:
        if ((data->wildcard).state != CURLWC_CLEAN) {
          (data->wildcard).state = (uint)(unaff_EBP != CURLE_OK) * 4 + CURLWC_MATCHING;
        }
        goto LAB_005c5c63;
      case CURLWC_MATCHING:
        puVar3 = (undefined8 *)(data->wildcard).protdata;
        (data->set).fwrite_func = (curl_write_callback)puVar3[1];
        (data->set).out = (void *)puVar3[2];
        puVar3[1] = 0;
        puVar3[2] = 0;
        (data->wildcard).state = CURLWC_DOWNLOADING;
        CVar8 = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar3);
        if (CVar8 == CURLE_OK) {
          bVar16 = true;
          if ((data->wildcard).filelist.size == 0) {
            unaff_EBP = CURLE_REMOTE_FILE_NOT_FOUND;
            goto LAB_005c5868;
          }
        }
        else {
LAB_005c5868:
          (data->wildcard).state = CURLWC_CLEAN;
          bVar16 = CVar8 != CURLE_OK;
        }
        if (!bVar16) goto LAB_005c5c63;
        break;
      case CURLWC_DOWNLOADING:
        puVar3 = (undefined8 *)((data->wildcard).filelist.head)->ptr;
        pFVar4 = (data->req).p.file;
        pcVar11 = curl_maprintf("%s%s",(data->wildcard).path,*puVar3);
        iVar15 = 1;
        if (pcVar11 == (char *)0x0) {
          unaff_EBP = CURLE_OUT_OF_MEMORY;
        }
        else {
          (*Curl_cfree)(pFVar4->freepath);
          pFVar4->path = pcVar11;
          pFVar4->freepath = pcVar11;
          Curl_infof(data,"Wildcard - START of \"%s\"",*puVar3);
          if ((data->set).chunk_bgn != (curl_chunk_bgn_callback)0x0) {
            Curl_set_in_callback(data,true);
            lVar12 = (*(data->set).chunk_bgn)
                               (puVar3,(data->wildcard).customptr,
                                (int)(data->wildcard).filelist.size);
            Curl_set_in_callback(data,false);
            if (lVar12 == 1) {
              unaff_EBP = CURLE_CHUNK_FAILED;
              iVar15 = 1;
              bVar16 = false;
            }
            else {
              bVar16 = lVar12 != 2;
              if (bVar16) {
                iVar15 = 0;
              }
              else {
                Curl_infof(data,"Wildcard - \"%s\" skipped by user",*puVar3);
                (data->wildcard).state = CURLWC_SKIP;
                iVar15 = 3;
              }
            }
            if (!bVar16) goto LAB_005c5a45;
          }
          if (*(int *)(puVar3 + 1) == 0) {
            if ((*(byte *)(puVar3 + 0xc) & 0x40) != 0) {
              (pcVar2->proto).ftpc.known_filesize = puVar3[5];
            }
            unaff_EBP = ftp_parse_url_path(data);
            iVar15 = 1;
            CVar10 = unaff_EBP;
            if (unaff_EBP == CURLE_OK) {
              CVar10 = CURLE_OK;
              Curl_llist_remove(list,(data->wildcard).filelist.head,(void *)0x0);
              iVar15 = 1;
              if ((data->wildcard).filelist.size == 0) {
                wVar9 = CURLWC_CLEAN;
                unaff_EBP = CURLE_OK;
                goto LAB_005c59e9;
              }
              unaff_EBP = CURLE_OK;
            }
          }
          else {
            iVar15 = 3;
            wVar9 = CURLWC_SKIP;
LAB_005c59e9:
            (data->wildcard).state = wVar9;
          }
        }
LAB_005c5a45:
        if (iVar15 != 3) goto LAB_005c5c63;
        break;
      case CURLWC_CLEAN:
        unaff_EBP = CURLE_OK;
        if ((undefined8 *)*ppvVar1 != (undefined8 *)0x0) {
          unaff_EBP = Curl_ftp_parselist_geterror(**ppvVar1);
        }
        (data->wildcard).state = (unaff_EBP == CURLE_OK) + CURLWC_ERROR;
        goto LAB_005c5c63;
      case CURLWC_SKIP:
        if ((data->set).chunk_end != (curl_chunk_end_callback)0x0) {
          Curl_set_in_callback(data,true);
          (*(data->set).chunk_end)((data->wildcard).customptr);
          Curl_set_in_callback(data,false);
        }
        Curl_llist_remove(list,(data->wildcard).filelist.head,(void *)0x0);
        (data->wildcard).state = ((data->wildcard).filelist.size == 0) + CURLWC_DOWNLOADING;
      }
    } while( true );
  }
  unaff_EBP = ftp_parse_url_path(data);
joined_r0x005c5c7a:
  if (unaff_EBP != CURLE_OK) {
    return unaff_EBP;
  }
  pcVar2 = data->conn;
  (data->req).size = -1;
  Curl_pgrsSetUploadCounter(data,0);
  Curl_pgrsSetDownloadCounter(data,0);
  Curl_pgrsSetUploadSize(data,-1);
  Curl_pgrsSetDownloadSize(data,-1);
  (pcVar2->proto).ftpc.ctl_valid = true;
  pcVar6 = data->conn;
  if (((data->set).field_0x8e5 & 2) != 0) {
    ((data->req).p.file)->fd = 1;
  }
  *done = false;
  CVar10 = ftp_state_quote(data,true,FTP_QUOTE);
  if (CVar10 == CURLE_OK) {
    pcVar7 = data->conn;
    CVar10 = Curl_pp_statemach(data,&(pcVar7->proto).ftpc.pp,false,false);
    *done = (pcVar7->proto).ftpc.state == FTP_STOP;
    connected = (pcVar6->bits).tcpconnect[1];
    Curl_infof(data,"ftp_perform ends with SECONDARY: %d",(ulong)connected);
  }
  else {
    connected = false;
  }
  if (CVar10 == CURLE_OK) {
    if (*done != true) {
      return CURLE_OK;
    }
    CVar10 = ftp_dophase_done(data,connected);
    return CVar10;
  }
  freedirs(&(pcVar2->proto).ftpc);
  return CVar10;
switchD_005c57ce_caseD_0:
  p_Var5 = (data->wildcard).dtor;
  unaff_EBP = CVar10;
  if (p_Var5 != (wildcard_dtor)0x0) {
    (*p_Var5)(*ppvVar1);
  }
LAB_005c5c63:
  if (((data->wildcard).state | CURLWC_MATCHING) == CURLWC_DONE) {
    return CURLE_OK;
  }
  goto joined_r0x005c5c7a;
}

Assistant:

static CURLcode ftp_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  *done = FALSE; /* default to false */
  ftpc->wait_data_conn = FALSE; /* default to no such wait */

  if(data->state.wildcardmatch) {
    result = wc_statemach(data);
    if(data->wildcard.state == CURLWC_SKIP ||
      data->wildcard.state == CURLWC_DONE) {
      /* do not call ftp_regular_transfer */
      return CURLE_OK;
    }
    if(result) /* error, loop or skipping the file */
      return result;
  }
  else { /* no wildcard FSM needed */
    result = ftp_parse_url_path(data);
    if(result)
      return result;
  }

  result = ftp_regular_transfer(data, done);

  return result;
}